

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaIsGlobalItem(xmlSchemaTypePtr item)

{
  xmlSchemaTypeType xVar1;
  byte bVar2;
  
  xVar1 = item->type;
  if (xVar1 - XML_SCHEMA_TYPE_SIMPLE < 2) {
    bVar2 = (byte)item->flags & 8;
  }
  else if (xVar1 == XML_SCHEMA_TYPE_ELEMENT) {
    bVar2 = (byte)item->flags & 2;
  }
  else {
    if (xVar1 != XML_SCHEMA_TYPE_ATTRIBUTE) {
      return 1;
    }
    bVar2 = *(byte *)&item->facets & 1;
  }
  return (uint)(bVar2 != 0);
}

Assistant:

static int
xmlSchemaIsGlobalItem(xmlSchemaTypePtr item)
{
    switch (item->type) {
	case XML_SCHEMA_TYPE_COMPLEX:
	case XML_SCHEMA_TYPE_SIMPLE:
	    if (item->flags & XML_SCHEMAS_TYPE_GLOBAL)
		return(1);
	    break;
	case XML_SCHEMA_TYPE_GROUP:
	    return (1);
	case XML_SCHEMA_TYPE_ELEMENT:
	    if ( ((xmlSchemaElementPtr) item)->flags &
		XML_SCHEMAS_ELEM_GLOBAL)
		return(1);
	    break;
	case XML_SCHEMA_TYPE_ATTRIBUTE:
	    if ( ((xmlSchemaAttributePtr) item)->flags &
		XML_SCHEMAS_ATTR_GLOBAL)
		return(1);
	    break;
	/* Note that attribute groups are always global. */
	default:
	    return(1);
    }
    return (0);
}